

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unique_deferring_queue.h
# Opt level: O1

uint __thiscall
wasm::UniqueDeferredQueue<unsigned_int>::pop(UniqueDeferredQueue<unsigned_int> *this)

{
  _Map_pointer ppuVar1;
  uint *puVar2;
  mapped_type *pmVar3;
  uint local_2c [2];
  uint item;
  
  do {
    ppuVar1 = (this->data).c.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Deque_impl_data._M_finish._M_node;
    puVar2 = (this->data).c.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Deque_impl_data._M_start._M_cur;
    if (((long)(this->data).c.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
               .super__Deque_impl_data._M_start._M_last - (long)puVar2 >> 2) +
        ((long)(this->data).c.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
               .super__Deque_impl_data._M_finish._M_cur -
         (long)(this->data).c.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
               .super__Deque_impl_data._M_finish._M_first >> 2) +
        ((((ulong)((long)ppuVar1 -
                  (long)(this->data).c.
                        super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
        (ulong)(ppuVar1 == (_Map_pointer)0x0)) * 0x80 == 0) {
      __assert_fail("!empty()",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/support/unique_deferring_queue.h"
                    ,0x34,"T wasm::UniqueDeferredQueue<unsigned int>::pop() [T = unsigned int]");
    }
    local_2c[0] = *puVar2;
    pmVar3 = std::__detail::
             _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_long>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_long>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)&this->count,local_2c);
    *pmVar3 = *pmVar3 - 1;
    std::deque<unsigned_int,_std::allocator<unsigned_int>_>::pop_front
              ((deque<unsigned_int,_std::allocator<unsigned_int>_> *)this);
    pmVar3 = std::__detail::
             _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_long>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_long>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)&this->count,local_2c);
  } while (*pmVar3 != 0);
  return local_2c[0];
}

Assistant:

T pop() {
    while (1) {
      assert(!empty());
      T item = data.front();
      count[item]--;
      data.pop();
      if (count[item] == 0) {
        return item;
      }
      // skip this one, keep going
    }
  }